

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsystemtrayicon_x11.cpp
# Opt level: O3

void __thiscall QSystemTrayIconPrivate::~QSystemTrayIconPrivate(QSystemTrayIconPrivate *this)

{
  Data *pDVar1;
  Data *pDVar2;
  
  *(undefined ***)this = &PTR__QSystemTrayIconPrivate_00816770;
  if (this->qpa_sys != (QPlatformSystemTrayIcon *)0x0) {
    (**(code **)(*(long *)this->qpa_sys + 0x20))();
  }
  pDVar1 = (this->toolTip).d.d;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->toolTip).d.d)->super_QArrayData,2,0x10);
    }
  }
  QIcon::~QIcon(&this->icon);
  pDVar2 = (this->menu).wp.d;
  if (pDVar2 != (Data *)0x0) {
    LOCK();
    *(int *)pDVar2 = *(int *)pDVar2 + -1;
    UNLOCK();
    if (*(int *)pDVar2 == 0) {
      pDVar2 = (this->menu).wp.d;
      if (pDVar2 == (Data *)0x0) {
        pDVar2 = (Data *)0x0;
      }
      operator_delete(pDVar2);
    }
  }
  QObjectPrivate::~QObjectPrivate(&this->super_QObjectPrivate);
  return;
}

Assistant:

QSystemTrayIconPrivate::~QSystemTrayIconPrivate()
{
    delete qpa_sys;
}